

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

bool __thiscall IceCore::Container::Delete(Container *this,udword entry)

{
  uint uVar1;
  uint local_28;
  udword i;
  udword entry_local;
  Container *this_local;
  
  local_28 = 0;
  while( true ) {
    if (this->mCurNbEntries <= local_28) {
      return false;
    }
    if (this->mEntries[local_28] == entry) break;
    local_28 = local_28 + 1;
  }
  uVar1 = this->mCurNbEntries - 1;
  this->mCurNbEntries = uVar1;
  this->mEntries[local_28] = this->mEntries[uVar1];
  return true;
}

Assistant:

bool Container::Delete(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i. The strategy is to copy the last current entry at index i, and decrement the current number of entries.
			DeleteIndex(i);
			return true;
		}
	}
	return false;
}